

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

bool xmrig::Buffer::fromHex(uint8_t *in,size_t size,uint8_t *out)

{
  uint8_t uVar1;
  byte bVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  bool error;
  ulong local_30;
  bool local_21;
  long local_20;
  ulong local_18;
  long local_10;
  
  local_20 = CONCAT71(in_register_00000011,in_DL);
  local_21 = false;
  local_30 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_18 <= local_30) {
      return true;
    }
    uVar1 = hf_hex2bin(*(uint8_t *)(local_10 + local_30),&local_21);
    bVar2 = hf_hex2bin(*(uint8_t *)(local_10 + 1 + local_30),&local_21);
    *(byte *)(local_20 + (local_30 >> 1)) = uVar1 << 4 | bVar2;
    if ((local_21 & 1U) != 0) break;
    local_30 = local_30 + 2;
  }
  return false;
}

Assistant:

bool xmrig::Buffer::fromHex(const uint8_t *in, size_t size, uint8_t *out)
{
    bool error = false;
    for (size_t i = 0; i < size; i += 2) {
        out[i / 2] = static_cast<uint8_t>((hf_hex2bin(in[i], error) << 4) | hf_hex2bin(in[i + 1], error));

        if (error) {
            return false;
        }
    }

    return true;
}